

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuAstcUtil.cpp
# Opt level: O3

AssignBlock128
tcu::astc::anon_unknown_0::generateNormalBlock
          (NormalBlockParams *blockParams,int blockWidth,int blockHeight,
          NormalBlockISEInputs *iseInputs)

{
  ISEMode IVar1;
  int iVar2;
  ulong uVar3;
  deUint32 *pdVar4;
  long lVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  int iVar10;
  uint uVar11;
  uint uVar12;
  int *piVar13;
  int iVar14;
  undefined4 in_register_00000034;
  ISEInput *input;
  deUint32 *pdVar15;
  int iVar16;
  long lVar17;
  deUint32 *pdVar18;
  uint uVar19;
  deUint32 dVar20;
  uint uVar21;
  int iVar22;
  int iVar23;
  ulong uVar24;
  bool bVar25;
  bool bVar26;
  AssignBlock128 AVar27;
  AssignBlock128 local_88;
  ISEMode local_6c;
  BitAssignAccessStream local_68;
  ISEInput *local_50;
  ISEParams *local_48;
  ulong local_40;
  ISEParams local_38;
  
  input = (ISEInput *)CONCAT44(in_register_00000034,blockWidth);
  uVar24 = 0x1fffffffe00;
  local_88.m_words[0] = 0;
  local_88.m_words[1] = 0;
  iVar23 = blockParams->weightGridWidth;
  iVar10 = blockParams->weightGridHeight;
  bVar26 = blockParams->isDualPlane;
  uVar8 = iVar10 * iVar23 << (bVar26 & 0x1fU);
  local_6c = (blockParams->weightISEParams).mode;
  iVar16 = (blockParams->weightISEParams).numBits;
  uVar12 = 0xffffffff;
  local_40 = (ulong)uVar8;
  if (local_6c == ISEMODE_PLAIN_BIT) {
    iVar14 = uVar8 * iVar16;
    uVar8 = ~(-1 << ((byte)iVar16 & 0x1f));
  }
  else {
    if (local_6c == ISEMODE_QUINT) {
      iVar14 = (uVar8 * iVar16 + (int)(uVar8 * 7) / 3 + 1) -
               (uint)(uVar8 * -0x55555553 + 0x2aaaaaaa < 0x55555555);
      iVar2 = 5;
    }
    else {
      if (local_6c != ISEMODE_TRIT) {
        iVar14 = -1;
        goto switchD_019c63b2_caseD_6;
      }
      iVar14 = (uVar8 * iVar16 + (int)(uVar8 * 8) / 5 + 1) -
               (uint)(uVar8 * 0x66666668 + 0x19999999 < 0x33333333);
      iVar2 = 3;
    }
    uVar8 = (iVar2 << ((byte)iVar16 & 0x1f)) - 1;
  }
  switch(uVar8) {
  case 1:
    uVar24 = 0;
    goto LAB_019c63d3;
  case 2:
    uVar12 = 3;
    break;
  case 3:
    uVar12 = 4;
    break;
  case 4:
    uVar12 = 5;
    break;
  case 5:
    uVar12 = 6;
    break;
  case 6:
  case 8:
  case 10:
  case 0xc:
  case 0xd:
  case 0xe:
  case 0x10:
  case 0x11:
  case 0x12:
  case 0x14:
  case 0x15:
  case 0x16:
    goto switchD_019c63b2_caseD_6;
  case 7:
    uVar12 = 7;
    break;
  case 9:
    uVar24 = 0x200;
LAB_019c63d3:
    uVar12 = 2;
    goto switchD_019c63b2_caseD_6;
  case 0xb:
    uVar12 = 3;
    goto LAB_019c6424;
  case 0xf:
    uVar12 = 4;
    goto LAB_019c6424;
  case 0x13:
    uVar12 = 5;
    goto LAB_019c6424;
  case 0x17:
    uVar12 = 6;
    goto LAB_019c6424;
  default:
    if (uVar8 != 0x1f) goto switchD_019c63b2_caseD_6;
    uVar12 = 7;
LAB_019c6424:
    uVar24 = 0x200;
    goto switchD_019c63b2_caseD_6;
  }
  uVar24 = 0;
switchD_019c63b2_caseD_6:
  piVar13 = &DAT_01ccb6c4;
  uVar3 = 0;
  local_48 = &blockParams->weightISEParams;
LAB_019c6444:
  local_68.m_dst =
       (AssignBlock128 *)((ulong)(uint)~(-1 << (*(byte *)(piVar13 + -5) & 0x1f)) << 0x20);
  local_68.m_startNdxInSrc = ~(-1 << (*(byte *)(piVar13 + -4) & 0x1f));
  iVar2 = piVar13[-2];
  uVar8 = iVar23 - iVar2;
  if ((iVar23 < iVar2) ||
     (uVar9 = piVar13[-3], iVar2 + *(int *)((long)&local_68.m_dst + (ulong)uVar9 * 4) < iVar23))
  goto LAB_019c64a1;
  iVar2 = *piVar13;
  if ((iVar10 < iVar2) ||
     (uVar11 = piVar13[-1], iVar2 + *(int *)((long)&local_68.m_dst + (ulong)uVar11 * 4) < iVar10))
  goto LAB_019c64a1;
  if (uVar9 == 1) {
    uVar6 = 0xffffffff;
  }
  else {
    uVar6 = uVar8;
    if (uVar9 != 2) {
      uVar6 = 0xffffffff;
    }
    uVar8 = 0xffffffff;
  }
  uVar9 = iVar10 - iVar2;
  if ((uVar11 != 1) && (uVar9 = uVar8, uVar11 == 2)) {
    uVar6 = iVar10 - iVar2;
  }
  if ((uint)uVar3 < 10) {
    uVar19 = uVar9 & 1;
    uVar8 = uVar9 >> 1 & 1;
    uVar11 = uVar6 & 1;
    uVar21 = uVar6 >> 1 & 1;
    uVar7 = uVar12 & 1;
    uVar9 = uVar12 >> 1 & 1;
    uVar12 = uVar12 >> 2 & 1;
    switch(uVar3 & 0xffffffff) {
    case 0:
      uVar8 = uVar9 + uVar12 * 2 |
              uVar7 << 4 | uVar19 << 5 | uVar8 << 6 | uVar11 << 7 | uVar21 << 8 | (uint)bVar26 << 10
      ;
      goto LAB_019c66d9;
    case 1:
      uVar24 = (uVar9 + uVar12 * 2 |
               uVar7 << 4 |
               uVar19 << 5 | uVar8 << 6 | uVar11 << 7 | uVar21 << 8 | (uint)bVar26 << 10) | uVar24 |
               4;
      break;
    case 2:
      uVar24 = (uVar9 + uVar12 * 2 |
               uVar7 << 4 |
               uVar19 << 5 | uVar8 << 6 | uVar11 << 7 | uVar21 << 8 | (uint)bVar26 << 10) | uVar24 |
               8;
      break;
    case 3:
      uVar24 = (ulong)bVar26 << 10 | uVar24 |
               (ulong)(uVar7 * 0x10 + uVar12 * 2 | uVar9) | (ulong)uVar6 << 7 | (ulong)(uVar19 << 5)
               | (ulong)(uVar8 << 6) | 0xc;
      break;
    case 4:
      uVar24 = (uVar8 << 6 | (uint)bVar26 << 10) | uVar24 |
               (ulong)(uVar7 * 0x10 + uVar12 * 2 | uVar19 << 5 | uVar9) | (ulong)uVar6 << 7 | 0x10c;
      break;
    case 5:
      uVar8 = (uVar7 << 4 | uVar19 << 5 | uVar8 << 6 | (uint)bVar26 << 10) + uVar12 * 8 + uVar9 * 4;
LAB_019c66d9:
      uVar24 = uVar8 | uVar24;
      break;
    case 6:
      uVar24 = uVar24 | (uVar7 << 4 | uVar19 << 5 | uVar8 << 6 | (uint)bVar26 << 10) + uVar12 * 8 +
                        uVar9 * 4 | 0x80;
      break;
    case 7:
      uVar24 = uVar24 | (uVar7 << 4 | (uint)bVar26 << 10) + uVar12 * 8 + uVar9 * 4 | 0x180;
      break;
    case 8:
      uVar24 = uVar24 | (uVar7 << 4 | (uint)bVar26 << 10) + uVar12 * 8 + uVar9 * 4 | 0x1a0;
      break;
    case 9:
      uVar24 = (ulong)(uVar7 * 0x10 + uVar12 * 8 + uVar9 * 4 | uVar19 << 5 | uVar11 << 9 |
                       uVar8 << 6 | uVar21 << 10 | 0x100);
    }
    uVar24 = uVar24 & 0xffffffffffffe7ff;
    goto LAB_019c6743;
  }
  goto LAB_019c64ae;
LAB_019c64a1:
  uVar3 = uVar3 + 1;
  piVar13 = piVar13 + 6;
  if (uVar3 == 10) goto LAB_019c64ae;
  goto LAB_019c6444;
LAB_019c64ae:
  uVar24 = 0;
LAB_019c6743:
  iVar23 = blockParams->numPartitions;
  lVar17 = (long)iVar23;
  uVar3 = (ulong)(iVar23 - 1) << 0xb | uVar24;
  if (lVar17 < 2) {
    if (iVar23 != 1) goto LAB_019c6786;
    local_88.m_words[0] =
         (ulong)blockParams->colorEndpointModes[0] << 0xd | uVar24 & 0xfffffffffffe07ff;
LAB_019c67a1:
    iVar10 = 1 - iVar14;
  }
  else {
    uVar3 = uVar3 & 0xffffffffff801fff | (ulong)blockParams->partitionSeed << 0xd;
LAB_019c6786:
    if (blockParams->isMultiPartSingleCemMode != false) {
      local_88.m_words[0] =
           (ulong)blockParams->colorEndpointModes[0] << 0x19 | uVar3 & 0xffffffffe07fffff;
      goto LAB_019c67a1;
    }
    if (iVar23 == 3) {
      iVar10 = -4 - iVar14;
      iVar14 = 0x7b - iVar14;
      pdVar4 = blockParams->colorEndpointModes + 3;
LAB_019c6815:
      pdVar18 = blockParams->colorEndpointModes + 1;
      pdVar15 = blockParams->colorEndpointModes;
      dVar20 = *pdVar15;
      do {
        uVar8 = *pdVar18;
        bVar25 = dVar20 < uVar8;
        if (dVar20 <= uVar8) {
          dVar20 = uVar8;
        }
        if (bVar25) {
          pdVar15 = pdVar18;
        }
        pdVar18 = pdVar18 + 1;
      } while (pdVar18 != pdVar4);
    }
    else {
      if (iVar23 == 4) {
        iVar10 = -7 - iVar14;
        iVar14 = 0x78 - iVar14;
LAB_019c680d:
        pdVar4 = blockParams->colorEndpointModes + lVar17;
        goto LAB_019c6815;
      }
      iVar10 = (uint)(iVar23 == 2) + iVar14;
      pdVar15 = blockParams->colorEndpointModes;
      iVar14 = 0x7f - iVar10;
      iVar10 = -iVar10;
      if (iVar23 != 0) goto LAB_019c680d;
    }
    uVar8 = (*pdVar15 >> 2) + (uint)(*pdVar15 >> 2 == 0);
    local_88.m_words[0] = (ulong)uVar8 << 0x17 | uVar3 & 0xfffffffffe7fffff;
    if (0 < iVar23) {
      local_50 = input;
      lVar5 = 0;
      uVar12 = 0x19;
      do {
        uVar9 = *(uint *)((long)blockParams->colorEndpointModes + lVar5 * 2);
        uVar11 = uVar12 + 0x3f;
        if (-1 < (int)uVar12) {
          uVar11 = uVar12;
        }
        iVar2 = (int)lVar5;
        uVar6 = iVar23 + iVar2;
        local_88.m_words[(int)uVar11 >> 6] =
             (ulong)(uVar9 >> 2 == uVar8) << ((byte)uVar12 & 0x3f) |
             local_88.m_words[(int)uVar11 >> 6] & ~(1L << ((ulong)uVar12 & 0x3f));
        iVar22 = iVar14 + -4;
        if (uVar6 < 4) {
          iVar22 = 0x19;
        }
        uVar7 = uVar6 + iVar22;
        uVar11 = iVar22 + uVar6 + 0x3f;
        if (-1 < (int)uVar7) {
          uVar11 = uVar7;
        }
        local_88.m_words[(int)uVar11 >> 6] =
             (ulong)(uVar9 & 1) << ((byte)uVar7 & 0x3f) |
             local_88.m_words[(int)uVar11 >> 6] & ~(1L << ((ulong)uVar7 & 0x3f));
        iVar22 = iVar23 + 0x1a;
        if (3 < iVar23 + iVar2 + 1U) {
          iVar22 = iVar14 + iVar23 + -3;
        }
        uVar11 = iVar22 + iVar2;
        uVar6 = uVar11 + 0x3f;
        if (-1 < (int)uVar11) {
          uVar6 = uVar11;
        }
        local_88.m_words[(int)uVar6 >> 6] =
             (ulong)(uVar9 >> 1 & 1) << ((byte)uVar11 & 0x3f) |
             local_88.m_words[(int)uVar6 >> 6] & ~(1L << ((ulong)uVar11 & 0x3f));
        lVar5 = lVar5 + 2;
        uVar12 = uVar12 + 1;
        input = local_50;
      } while (lVar17 * 2 != lVar5);
    }
  }
  if (bVar26 != false) {
    AssignBlock128::setBits(&local_88,iVar10 + 0x7d,iVar10 + 0x7e,blockParams->ccs);
  }
  iVar23 = (int)local_40;
  if (local_6c == ISEMODE_PLAIN_BIT) {
    local_68.m_length = iVar16 * iVar23;
  }
  else {
    if (local_6c == ISEMODE_QUINT) {
      iVar10 = iVar16 * iVar23 + (iVar23 * 7) / 3;
      bVar26 = iVar23 * -0x55555553 + 0x2aaaaaaaU < 0x55555555;
    }
    else {
      local_68.m_length = -1;
      if (local_6c != ISEMODE_TRIT) goto LAB_019c6a31;
      iVar10 = iVar16 * iVar23 + (iVar23 * 8) / 5;
      bVar26 = iVar23 * 0x66666668 + 0x19999999U < 0x33333333;
    }
    local_68.m_length = (iVar10 + 1) - (uint)bVar26;
  }
LAB_019c6a31:
  local_68.m_startNdxInSrc = 0x7f;
  local_68.m_forward = false;
  local_68.m_ndx = 0;
  local_68.m_dst = &local_88;
  encodeISE(&local_68,local_48,input,iVar23);
  uVar8 = blockParams->numPartitions;
  uVar24 = (ulong)uVar8;
  if (blockParams->isMultiPartSingleCemMode == false) {
    if ((int)uVar8 < 1) {
      iVar23 = 0;
    }
    else {
      uVar3 = 0;
      iVar23 = 0;
      do {
        iVar23 = iVar23 + (blockParams->colorEndpointModes[uVar3] >> 2) * 2 + 2;
        uVar3 = uVar3 + 1;
      } while (uVar24 != uVar3);
    }
  }
  else {
    iVar23 = ((blockParams->colorEndpointModes[0] >> 2) * 2 + 2) * uVar8;
  }
  iVar16 = blockParams->weightGridHeight * blockParams->weightGridWidth <<
           (blockParams->isDualPlane & 0x1fU);
  IVar1 = (blockParams->weightISEParams).mode;
  iVar10 = (blockParams->weightISEParams).numBits;
  if (IVar1 == ISEMODE_PLAIN_BIT) {
    iVar14 = iVar16 * iVar10;
  }
  else {
    if (IVar1 == ISEMODE_QUINT) {
      iVar10 = iVar10 * iVar16 + (iVar16 * 7) / 3;
      bVar26 = iVar16 * -0x55555553 + 0x2aaaaaaaU < 0x55555555;
    }
    else {
      iVar14 = -1;
      if (IVar1 != ISEMODE_TRIT) goto LAB_019c6b5e;
      iVar10 = iVar10 * iVar16 + (iVar16 * 8) / 5;
      bVar26 = iVar16 * 0x66666668 + 0x19999999U < 0x33333333;
    }
    iVar14 = (iVar10 + 1) - (uint)bVar26;
  }
LAB_019c6b5e:
  iVar10 = -0x1d;
  if (blockParams->isMultiPartSingleCemMode == false) {
    iVar10 = uVar8 * -3 + -0x19;
  }
  iVar16 = -0x11;
  if (uVar24 != 1) {
    iVar16 = iVar10;
  }
  iVar16 = ((uint)(blockParams->isDualPlane ^ 1) * 2 - iVar14) + 0x7e + iVar16;
  iVar10 = 0x1d;
  if (uVar24 == 1) {
    iVar10 = 0x11;
  }
  local_38 = computeMaximumRangeISEParams(iVar16,iVar23);
  local_68.m_forward = true;
  local_68.m_ndx = 0;
  local_68.m_dst = &local_88;
  local_68.m_startNdxInSrc = iVar10;
  local_68.m_length = iVar16;
  encodeISE(&local_68,&local_38,input + 1,iVar23);
  AVar27.m_words[0] = local_88.m_words[0];
  AVar27.m_words[1] = local_88.m_words[1];
  return (AssignBlock128)AVar27.m_words;
}

Assistant:

static AssignBlock128 generateNormalBlock (const NormalBlockParams& blockParams, int blockWidth, int blockHeight, const NormalBlockISEInputs& iseInputs)
{
	DE_ASSERT(isValidBlockParams(blockParams, blockWidth, blockHeight));
	DE_UNREF(blockWidth);	// \note For non-debug builds.
	DE_UNREF(blockHeight);	// \note For non-debug builds.

	AssignBlock128	block;
	const int		numWeights		= computeNumWeights(blockParams);
	const int		numWeightBits	= computeNumRequiredBits(blockParams.weightISEParams, numWeights);

	writeBlockMode(block, blockParams);

	block.setBits(11, 12, blockParams.numPartitions - 1);
	if (blockParams.numPartitions > 1)
		block.setBits(13, 22, blockParams.partitionSeed);

	{
		const int extraCemBitsStart = 127 - numWeightBits - (blockParams.numPartitions == 1 || blockParams.isMultiPartSingleCemMode		? -1
															: blockParams.numPartitions == 4											? 7
															: blockParams.numPartitions == 3											? 4
															: blockParams.numPartitions == 2											? 1
															: 0);

		writeColorEndpointModes(block, &blockParams.colorEndpointModes[0], blockParams.isMultiPartSingleCemMode, blockParams.numPartitions, extraCemBitsStart);

		if (blockParams.isDualPlane)
			block.setBits(extraCemBitsStart-2, extraCemBitsStart-1, blockParams.ccs);
	}

	writeWeightData(block, blockParams.weightISEParams, iseInputs.weight, numWeights);

	{
		const int			numColorEndpointValues		= computeNumColorEndpointValues(&blockParams.colorEndpointModes[0], blockParams.numPartitions, blockParams.isMultiPartSingleCemMode);
		const int			numBitsForColorEndpoints	= computeNumBitsForColorEndpoints(blockParams);
		const int			colorEndpointDataStartNdx	= blockParams.numPartitions == 1 ? 17 : 29;
		const ISEParams&	colorEndpointISEParams		= computeMaximumRangeISEParams(numBitsForColorEndpoints, numColorEndpointValues);

		writeColorEndpointData(block, colorEndpointISEParams, iseInputs.endpoint, numColorEndpointValues, numBitsForColorEndpoints, colorEndpointDataStartNdx);
	}

	return block;
}